

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O3

string * Potassco::xconvert(string *out,long n)

{
  anon_union_64_3_812e3e79_for_StringBuilder_0 local_48;
  
  local_48.sbo_[0x3f] = '@';
  local_48.str_ = out;
  StringBuilder::append_((StringBuilder *)&local_48.buf_,n,-1 < n);
  StringBuilder::~StringBuilder((StringBuilder *)&local_48.buf_);
  return out;
}

Assistant:

string& xconvert(string& out, long n) { return (StringBuilder(out).append(n), out); }